

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCommentImpl.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMCommentImpl::cloneNode(DOMCommentImpl *this,bool deep)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  DOMCommentImpl *this_00;
  
  iVar1 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])();
  plVar2 = (long *)(**(code **)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x18) + 0x130))
                             (CONCAT44(extraout_var,iVar1) + 0x18,
                              &XMLUni::fgXercescInterfaceDOMMemoryManager,0);
  this_00 = (DOMCommentImpl *)(**(code **)(*plVar2 + 0x28))(plVar2,0x50,3);
  DOMCommentImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * DOMCommentImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (getOwnerDocument(), DOMMemoryManager::COMMENT_OBJECT) DOMCommentImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}